

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

Error __thiscall asmjit::_abi_1_10::BaseEmitter::onAttach(BaseEmitter *this,CodeHolder *code)

{
  Arch AVar1;
  OperandSignature OVar2;
  
  this->_code = code;
  this->_environment = code->_environment;
  this->_emitterFlags = this->_emitterFlags | kAttached;
  AVar1 = (code->_environment)._arch;
  OVar2 = ArchTraits::regTypeToSignature
                    ((ArchTraits *)(_archTraits + (ulong)AVar1 * 0xd8),AVar1 & k32BitMask ^ kThumb);
  (this->_gpSignature)._bits = OVar2._bits;
  (*this->_vptr_BaseEmitter[0x12])(this);
  return 0;
}

Assistant:

Error BaseEmitter::onAttach(CodeHolder* code) noexcept {
  _code = code;
  _environment = code->environment();
  _addEmitterFlags(EmitterFlags::kAttached);

  const ArchTraits& archTraits = ArchTraits::byArch(code->arch());
  RegType nativeRegType = Environment::is32Bit(code->arch()) ? RegType::kGp32 : RegType::kGp64;
  _gpSignature = archTraits.regTypeToSignature(nativeRegType);

  onSettingsUpdated();
  return kErrorOk;
}